

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O0

int evthread_use_pthreads(void)

{
  int iVar1;
  undefined1 local_60 [8];
  evthread_condition_callbacks cond_cbs;
  evthread_lock_callbacks cbs;
  
  memcpy(&cond_cbs.wait_condition,&DAT_00483cb0,0x28);
  memcpy(local_60,&DAT_00483cd8,0x28);
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&attr_recursive);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr_recursive,1);
    if (iVar1 == 0) {
      evthread_set_lock_callbacks((evthread_lock_callbacks *)&cond_cbs.wait_condition);
      evthread_set_condition_callbacks((evthread_condition_callbacks *)local_60);
      evthread_set_id_callback(evthread_posix_get_id);
      cbs.unlock._4_4_ = 0;
    }
    else {
      cbs.unlock._4_4_ = -1;
    }
  }
  else {
    cbs.unlock._4_4_ = -1;
  }
  return cbs.unlock._4_4_;
}

Assistant:

int
evthread_use_pthreads(void)
{
	struct evthread_lock_callbacks cbs = {
		EVTHREAD_LOCK_API_VERSION,
		EVTHREAD_LOCKTYPE_RECURSIVE,
		evthread_posix_lock_alloc,
		evthread_posix_lock_free,
		evthread_posix_lock,
		evthread_posix_unlock
	};
	struct evthread_condition_callbacks cond_cbs = {
		EVTHREAD_CONDITION_API_VERSION,
		evthread_posix_cond_alloc,
		evthread_posix_cond_free,
		evthread_posix_cond_signal,
		evthread_posix_cond_wait
	};
	/* Set ourselves up to get recursive locks. */
	if (pthread_mutexattr_init(&attr_recursive))
		return -1;
	if (pthread_mutexattr_settype(&attr_recursive, PTHREAD_MUTEX_RECURSIVE))
		return -1;

	evthread_set_lock_callbacks(&cbs);
	evthread_set_condition_callbacks(&cond_cbs);
	evthread_set_id_callback(evthread_posix_get_id);
	return 0;
}